

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O0

int __thiscall
cppcms::applications_pool::mount
          (applications_pool *this,char *__special_file,char *__dir,char *__fstype,ulong __rwflag,
          void *__data)

{
  int extraout_EAX;
  _data *this_00;
  unique_lock<std::recursive_mutex> lock;
  shared_ptr<cppcms::application_specific_pool> p;
  legacy_sync_pool *in_stack_ffffffffffffff08;
  application_specific_pool *in_stack_ffffffffffffff10;
  unique_ptr<cppcms::applications_pool::factory,_std::default_delete<cppcms::applications_pool::factory>_>
  *in_stack_ffffffffffffff18;
  value_type *__x;
  legacy_sync_pool *in_stack_ffffffffffffff20;
  _data *this_01;
  int in_stack_ffffffffffffff9c;
  application_specific_pool *in_stack_ffffffffffffffa0;
  
  operator_new(0x28);
  std::
  unique_ptr<cppcms::applications_pool::factory,_std::default_delete<cppcms::applications_pool::factory>_>
  ::unique_ptr((unique_ptr<cppcms::applications_pool::factory,_std::default_delete<cppcms::applications_pool::factory>_>
                *)in_stack_ffffffffffffff10,
               (unique_ptr<cppcms::applications_pool::factory,_std::default_delete<cppcms::applications_pool::factory>_>
                *)in_stack_ffffffffffffff08);
  impl::legacy_sync_pool::legacy_sync_pool(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  std::shared_ptr<cppcms::application_specific_pool>::
  shared_ptr<cppcms::impl::legacy_sync_pool,void>
            ((shared_ptr<cppcms::application_specific_pool> *)in_stack_ffffffffffffff10,
             in_stack_ffffffffffffff08);
  std::
  unique_ptr<cppcms::applications_pool::factory,_std::default_delete<cppcms::applications_pool::factory>_>
  ::~unique_ptr((unique_ptr<cppcms::applications_pool::factory,_std::default_delete<cppcms::applications_pool::factory>_>
                 *)in_stack_ffffffffffffff10);
  std::
  __shared_ptr_access<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x3aa20b);
  booster::hold_ptr<cppcms::applications_pool::_data>::operator->(&this->d);
  application_specific_pool::size(in_stack_ffffffffffffff10,(size_t)in_stack_ffffffffffffff08);
  std::
  __shared_ptr_access<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x3aa247);
  application_specific_pool::flags(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  booster::hold_ptr<cppcms::applications_pool::_data>::operator->(&this->d);
  std::unique_lock<std::recursive_mutex>::unique_lock
            ((unique_lock<std::recursive_mutex> *)in_stack_ffffffffffffff10,
             (mutex_type *)in_stack_ffffffffffffff08);
  this_00 = booster::hold_ptr<cppcms::applications_pool::_data>::operator->(&this->d);
  __x = (value_type *)&stack0xffffffffffffff68;
  this_01 = this_00;
  std::shared_ptr<cppcms::application_specific_pool>::shared_ptr
            ((shared_ptr<cppcms::application_specific_pool> *)this_00,
             (shared_ptr<cppcms::application_specific_pool> *)in_stack_ffffffffffffff08);
  _data::attachment::attachment
            ((attachment *)this_01,(shared_ptr<cppcms::application_specific_pool> *)__x,
             (mount_point *)this_00);
  std::__cxx11::
  list<cppcms::applications_pool::_data::attachment,_std::allocator<cppcms::applications_pool::_data::attachment>_>
  ::push_back(&this_01->apps,__x);
  _data::attachment::~attachment((attachment *)this_00);
  std::shared_ptr<cppcms::application_specific_pool>::~shared_ptr
            ((shared_ptr<cppcms::application_specific_pool> *)0x3aa2f7);
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)this_00)
  ;
  std::shared_ptr<cppcms::application_specific_pool>::~shared_ptr
            ((shared_ptr<cppcms::application_specific_pool> *)0x3aa311);
  return extraout_EAX;
}

Assistant:

void applications_pool::mount(std::unique_ptr<factory> aps,mount_point const &mp)
{
	booster::shared_ptr<application_specific_pool> p(new impl::legacy_sync_pool(std::move(aps)));
	p->size(d->thread_count);
	p->flags(app::legacy);

	booster::unique_lock<booster::recursive_mutex> lock(d->lock);
	d->apps.push_back(_data::attachment(p,mp));
}